

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf262.c
# Opt level: O0

void ymf262_set_mute_mask(void *chip,UINT32 MuteMask)

{
  byte local_21;
  UINT8 CurChn;
  OPL3 *opl3;
  UINT32 MuteMask_local;
  void *chip_local;
  
  for (local_21 = 0; local_21 < 0x12; local_21 = local_21 + 1) {
    *(byte *)((long)chip + (ulong)local_21 * 0xf0 + 0x10e) =
         (byte)(MuteMask >> (local_21 & 0x1f)) & 1;
  }
  for (local_21 = 0; local_21 < 5; local_21 = local_21 + 1) {
    *(byte *)((long)chip + (ulong)local_21 + 0x1268) =
         (byte)(MuteMask >> (local_21 + 0x12 & 0x1f)) & 1;
  }
  return;
}

Assistant:

void ymf262_set_mute_mask(void *chip, UINT32 MuteMask)
{
	OPL3 *opl3 = (OPL3 *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 18; CurChn ++)
		opl3->P_CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	for (CurChn = 0; CurChn < 5; CurChn ++)
		opl3->MuteSpc[CurChn] = (MuteMask >> (CurChn + 18)) & 0x01;
	
	return;
}